

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::ArrayInputStream::Next(ArrayInputStream *this,void **data,int *size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->position_;
  iVar2 = this->size_;
  if (iVar1 < iVar2) {
    iVar3 = iVar2 - iVar1;
    if (this->block_size_ <= iVar2 - iVar1) {
      iVar3 = this->block_size_;
    }
    this->last_returned_size_ = iVar3;
    *data = this->data_ + iVar1;
    *size = iVar3;
    this->position_ = this->position_ + this->last_returned_size_;
  }
  else {
    this->last_returned_size_ = 0;
  }
  return iVar1 < iVar2;
}

Assistant:

bool ArrayInputStream::Next(const void** data, int* size) {
  if (position_ < size_) {
    last_returned_size_ = std::min(block_size_, size_ - position_);
    *data = data_ + position_;
    *size = last_returned_size_;
    position_ += last_returned_size_;
    return true;
  } else {
    // We're at the end of the array.
    last_returned_size_ = 0;  // Don't let caller back up.
    return false;
  }
}